

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2EndElement(void *ctx,xmlChar *name)

{
  xmlNodePtr elem;
  uint uVar1;
  xmlNodePtr cur;
  xmlParserCtxtPtr ctxt;
  xmlChar *name_local;
  void *ctx_local;
  
  if (ctx != (void *)0x0) {
    elem = *(xmlNodePtr *)((long)ctx + 0x50);
    if ((elem != (xmlNodePtr)0x0) && (*(int *)((long)ctx + 0x68) != 0)) {
      *(long *)(*(long *)((long)ctx + 0x2c8) + 0x18) =
           *(long *)(*(long *)((long)ctx + 0x38) + 0x20) -
           *(long *)(*(long *)((long)ctx + 0x38) + 0x18);
      *(long *)(*(long *)((long)ctx + 0x2c8) + 0x20) =
           (long)*(int *)(*(long *)((long)ctx + 0x38) + 0x34);
      **(undefined8 **)((long)ctx + 0x2c8) = elem;
      xmlParserAddNodeInfo((xmlParserCtxtPtr)ctx,*(xmlParserNodeInfoPtr *)((long)ctx + 0x2c8));
    }
    *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
    if ((((*(int *)((long)ctx + 0x9c) != 0) && (*(int *)((long)ctx + 0x18) != 0)) &&
        (*(long *)((long)ctx + 0x10) != 0)) && (*(long *)(*(long *)((long)ctx + 0x10) + 0x50) != 0))
    {
      uVar1 = xmlValidateOneElement
                        ((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10),elem);
      *(uint *)((long)ctx + 0x98) = uVar1 & *(uint *)((long)ctx + 0x98);
    }
    nodePop((xmlParserCtxtPtr)ctx);
  }
  return;
}

Assistant:

void
xmlSAX2EndElement(void *ctx, const xmlChar *name ATTRIBUTE_UNUSED)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlNodePtr cur;

    if (ctx == NULL) return;
    cur = ctxt->node;
#ifdef DEBUG_SAX
    if (name == NULL)
        xmlGenericError(xmlGenericErrorContext, "SAX.xmlSAX2EndElement(NULL)\n");
    else
	xmlGenericError(xmlGenericErrorContext, "SAX.xmlSAX2EndElement(%s)\n", name);
#endif

    /* Capture end position and add node */
    if (cur != NULL && ctxt->record_info) {
      ctxt->nodeInfo->end_pos = ctxt->input->cur - ctxt->input->base;
      ctxt->nodeInfo->end_line = ctxt->input->line;
      ctxt->nodeInfo->node = cur;
      xmlParserAddNodeInfo(ctxt, ctxt->nodeInfo);
    }
    ctxt->nodemem = -1;

#ifdef LIBXML_VALID_ENABLED
    if (ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset)
        ctxt->valid &= xmlValidateOneElement(&ctxt->vctxt, ctxt->myDoc,
					     cur);
#endif /* LIBXML_VALID_ENABLED */


    /*
     * end of parsing of this node.
     */
#ifdef DEBUG_SAX_TREE
    xmlGenericError(xmlGenericErrorContext, "popping(%s)\n", cur->name);
#endif
    nodePop(ctxt);
}